

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionPosition_line::ArchiveIN(ChFunctionPosition_line *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionPosition_line>(marchive);
  ChFunctionPosition::ArchiveIN(&this->super_ChFunctionPosition,marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->trajectory_line;
  local_38._name = "trajectory_line";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::geometry::ChLine>
            (marchive,(ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> *)&local_38);
  local_38._value = &this->space_fx;
  local_38._name = "space_fx";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionPosition_line::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionPosition_line>();
	// deserialize parent class
    ChFunctionPosition::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(trajectory_line);
	marchive >> CHNVP(space_fx);

}